

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testHuf.cpp
# Opt level: O1

void anon_unknown.dwarf_1714b5::fill2(unsigned_short *data,int n,int m,Rand48 *rand48)

{
  long lVar1;
  undefined4 in_register_00000014;
  double dVar2;
  
  memset(data,0,2000000);
  if (0 < n) {
    do {
      dVar2 = (double)Imath_2_5::erand48((ushort *)CONCAT44(in_register_00000014,m));
      lVar1 = Imath_2_5::nrand48((ushort *)CONCAT44(in_register_00000014,m));
      data[lVar1 % 1000000] = (unsigned_short)(int)(dVar2 * 65536.0);
      n = n + -1;
    } while (n != 0);
  }
  return;
}

Assistant:

void
fill2 (unsigned short data[/*n*/], int n, int m, IMATH_NAMESPACE::Rand48 & rand48)
{
    for (int i = 0; i < n; ++i)
	data[i] = 0;

    for (int i = 0; i < m; ++i)
	data[rand48.nexti() % n] = (unsigned short) (rand48.nextf() * (USHRT_MAX + 1));
}